

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O0

VkSamplerCreateInfo * __thiscall
vkt::pipeline::anon_unknown_0::SamplerTest::getSamplerCreateInfo
          (VkSamplerCreateInfo *__return_storage_ptr__,SamplerTest *this)

{
  VkBorderColor VVar1;
  VkSamplerCreateInfo *defaultSamplerParams;
  SamplerTest *this_local;
  
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->magFilter = VK_FILTER_NEAREST;
  __return_storage_ptr__->minFilter = VK_FILTER_NEAREST;
  __return_storage_ptr__->mipmapMode = VK_SAMPLER_MIPMAP_MODE_NEAREST;
  __return_storage_ptr__->addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  __return_storage_ptr__->addressModeV = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  __return_storage_ptr__->addressModeW = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  __return_storage_ptr__->mipLodBias = 0.0;
  __return_storage_ptr__->anisotropyEnable = 0;
  __return_storage_ptr__->maxAnisotropy = 1.0;
  __return_storage_ptr__->compareEnable = 0;
  __return_storage_ptr__->compareOp = VK_COMPARE_OP_NEVER;
  __return_storage_ptr__->minLod = 0.0;
  __return_storage_ptr__->maxLod = 0.25;
  VVar1 = getFormatBorderColor(BORDER_COLOR_TRANSPARENT_BLACK,this->m_imageFormat);
  __return_storage_ptr__->borderColor = VVar1;
  __return_storage_ptr__->unnormalizedCoordinates = 0;
  return __return_storage_ptr__;
}

Assistant:

VkSamplerCreateInfo SamplerTest::getSamplerCreateInfo (void) const
{
	const VkSamplerCreateInfo defaultSamplerParams =
	{
		VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,									// VkStructureType			sType;
		DE_NULL,																// const void*				pNext;
		0u,																		// VkSamplerCreateFlags		flags;
		VK_FILTER_NEAREST,														// VkFilter					magFilter;
		VK_FILTER_NEAREST,														// VkFilter					minFilter;
		VK_SAMPLER_MIPMAP_MODE_NEAREST,											// VkSamplerMipmapMode		mipmapMode;
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,									// VkSamplerAddressMode		addressModeU;
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,									// VkSamplerAddressMode		addressModeV;
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,									// VkSamplerAddressMode		addressModeW;
		0.0f,																	// float					mipLodBias;
		VK_FALSE,																// VkBool32					anisotropyEnable;
		1.0f,																	// float					maxAnisotropy;
		false,																	// VkBool32					compareEnable;
		VK_COMPARE_OP_NEVER,													// VkCompareOp				compareOp;
		0.0f,																	// float					minLod;
		0.25f,																	// float					maxLod;
		getFormatBorderColor(BORDER_COLOR_TRANSPARENT_BLACK, m_imageFormat),	// VkBorderColor			borderColor;
		false																	// VkBool32					unnormalizedCoordinates;
	};

	return defaultSamplerParams;
}